

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_cmd_ln.c
# Opt level: O0

int validate_cmn(char *switch_name,void *arg)

{
  int iVar1;
  void *arg_local;
  char *switch_name_local;
  
  iVar1 = strcmp((char *)arg,"current");
  if (((iVar1 != 0) && (iVar1 = strcmp((char *)arg,"none"), iVar1 != 0)) &&
     (iVar1 = strcmp((char *)arg,"prior"), iVar1 != 0)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/train_cmd_ln.c"
            ,0xd8,"Unknown CMN type %s %s\n",switch_name,arg);
  }
  return 1;
}

Assistant:

int
validate_cmn(char *switch_name, void *arg)
{

    if ((strcmp(arg, "current") == 0) ||
	(strcmp(arg, "none") == 0) ||
	(strcmp(arg, "prior") == 0)) {
	return TRUE;
    }
    else {
	E_ERROR("Unknown CMN type %s %s\n", switch_name, arg);
    }
    return TRUE;
}